

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::StringSplitRegexFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffbac;
  FunctionNullHandling in_stack_fffffffffffffbb8;
  allocator_type local_441;
  code *bind_lambda;
  LogicalType local_420;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_408;
  LogicalType varchar_list_type;
  LogicalType local_3d8;
  LogicalType local_3c0 [2];
  ScalarFunction regex_fun;
  ScalarFunction local_268;
  ScalarFunction local_140;
  
  LogicalType::LogicalType((LogicalType *)&regex_fun,VARCHAR);
  LogicalType::LIST(&varchar_list_type,(LogicalType *)&regex_fun);
  LogicalType::~LogicalType((LogicalType *)&regex_fun);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(local_3c0,VARCHAR);
  LogicalType::LogicalType(local_3c0 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_3c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_408,__l,&local_441);
  LogicalType::LogicalType(&local_420,&varchar_list_type);
  bind_lambda = StringSplitRegexFunction;
  LogicalType::LogicalType(&local_3d8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_3d8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffba4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 1;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffbac;
  ScalarFunction::ScalarFunction
            (&regex_fun,(vector<duckdb::LogicalType,_true> *)&local_408,&local_420,
             (scalar_function_t *)&stack0xfffffffffffffbc0,RegexpMatchesBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,RegexInitLocalState,
             varargs,CONSISTENT,in_stack_fffffffffffffbb8,bind_lambda);
  LogicalType::~LogicalType(&local_3d8);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffbc0);
  LogicalType::~LogicalType(&local_420);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_408);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_3c0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ScalarFunction::ScalarFunction(&local_140,&regex_fun);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_140);
  ScalarFunction::~ScalarFunction(&local_140);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
             &regex_fun.super_BaseScalarFunction.super_SimpleFunction.arguments,
             &LogicalType::VARCHAR);
  ScalarFunction::ScalarFunction(&local_268,&regex_fun);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_268);
  ScalarFunction::~ScalarFunction(&local_268);
  ScalarFunction::~ScalarFunction(&regex_fun);
  LogicalType::~LogicalType(&varchar_list_type);
  return in_RDI;
}

Assistant:

ScalarFunctionSet StringSplitRegexFun::GetFunctions() {
	auto varchar_list_type = LogicalType::LIST(LogicalType::VARCHAR);
	ScalarFunctionSet regexp_split;
	ScalarFunction regex_fun({LogicalType::VARCHAR, LogicalType::VARCHAR}, varchar_list_type, StringSplitRegexFunction,
	                         RegexpMatchesBind, nullptr, nullptr, RegexInitLocalState, LogicalType::INVALID,
	                         FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING);
	regexp_split.AddFunction(regex_fun);
	// regexp options
	regex_fun.arguments.emplace_back(LogicalType::VARCHAR);
	regexp_split.AddFunction(regex_fun);
	return regexp_split;
}